

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Writer::PerformPuts(BP3Writer *this)

{
  bool bVar1;
  int iVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  Variable<char> *pVVar6;
  Variable<signed_char> *pVVar7;
  Variable<int> *pVVar8;
  Variable<unsigned_short> *pVVar9;
  Variable<unsigned_int> *pVVar10;
  Variable<unsigned_long> *pVVar11;
  Variable<float> *pVVar12;
  Variable<double> *pVVar13;
  Variable<std::complex<float>_> *pVVar14;
  long in_RDI;
  Variable<std::complex<double>_> *variable_13;
  Variable<std::complex<float>_> *variable_12;
  Variable<long_double> *variable_11;
  Variable<double> *variable_10;
  Variable<float> *variable_9;
  Variable<unsigned_long> *variable_8;
  Variable<unsigned_int> *variable_7;
  Variable<unsigned_short> *variable_6;
  Variable<unsigned_char> *variable_5;
  Variable<long> *variable_4;
  Variable<int> *variable_3;
  Variable<short> *variable_2;
  Variable<signed_char> *variable_1;
  Variable<char> *variable;
  DataType type;
  string *variableName;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ScopedTimer __var261;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffaf8;
  Variable<std::complex<double>_> *in_stack_fffffffffffffb00;
  reference in_stack_fffffffffffffb28;
  IO *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  DataType in_stack_fffffffffffffb3c;
  BP3Writer *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  DataType in_stack_fffffffffffffc5c;
  Variable<short> *in_stack_fffffffffffffc60;
  allocator local_311;
  string local_310 [32];
  Variable<std::complex<double>_> *local_2f0;
  allocator<char> local_2e1;
  string local_2e0 [32];
  Variable<std::complex<float>_> *local_2c0;
  allocator local_2b1;
  string local_2b0 [32];
  BP3Writer *local_290;
  allocator local_281;
  string local_280 [32];
  Variable<double> *local_260;
  allocator local_251;
  string local_250 [32];
  Variable<float> *local_230;
  allocator local_221;
  string local_220 [32];
  Variable<unsigned_long> *local_200;
  allocator local_1f1;
  string local_1f0 [32];
  Variable<unsigned_int> *local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  Variable<unsigned_short> *local_1a0;
  allocator local_191;
  string local_190 [32];
  string *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  BPBase *in_stack_fffffffffffffea0;
  undefined1 local_131 [33];
  Variable<int> *local_110;
  allocator local_101;
  string local_100 [32];
  Variable<short> *local_e0;
  allocator local_d1;
  string local_d0 [32];
  Variable<signed_char> *local_b0;
  allocator local_a1;
  string local_a0 [32];
  Variable<char> *local_80;
  DataType local_74;
  reference local_70;
  _Self local_68;
  _Self local_60;
  long local_58;
  allocator local_49;
  string local_48 [36];
  undefined4 local_24;
  
  if ((PerformPuts()::__var61 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&PerformPuts()::__var61), iVar2 != 0)) {
    PerformPuts::__var61 = (void *)ps_timer_create_("BP3Writer::PerformPuts");
    __cxa_guard_release(&PerformPuts()::__var61);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x9fbeb7);
  if (bVar1) {
    local_24 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"in call to PerformPuts",&local_49);
    adios2::format::BPBase::ResizeBuffer
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_58 = in_RDI + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18) + 0x428;
    local_60._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffaf8);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffaf8);
    while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
      local_70 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffb00);
      DVar3 = IO::InquireVariableType(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      local_74 = DVar3;
      if (DVar3 != Struct) {
        DVar4 = helper::GetDataType<char>();
        DVar5 = local_74;
        if (DVar3 == DVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a0,"in call to PerformPuts, EndStep or Close",&local_a1);
          pVVar6 = Engine::FindVariable<char>
                             ((Engine *)in_stack_fffffffffffffc60,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                              in_stack_fffffffffffffc50);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          local_80 = pVVar6;
          PerformPutCommon<char>
                    (in_stack_fffffffffffffb40,
                     (Variable<char> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                    );
        }
        else {
          DVar4 = helper::GetDataType<signed_char>();
          DVar3 = local_74;
          if (DVar5 == DVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_d0,"in call to PerformPuts, EndStep or Close",&local_d1);
            pVVar7 = Engine::FindVariable<signed_char>
                               ((Engine *)in_stack_fffffffffffffc60,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                in_stack_fffffffffffffc50);
            std::__cxx11::string::~string(local_d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_d1);
            local_b0 = pVVar7;
            PerformPutCommon<signed_char>
                      (in_stack_fffffffffffffb40,
                       (Variable<signed_char> *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          }
          else {
            DVar5 = helper::GetDataType<short>();
            if (DVar3 == DVar5) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_100,"in call to PerformPuts, EndStep or Close",&local_101);
              in_stack_fffffffffffffc60 =
                   Engine::FindVariable<short>
                             ((Engine *)in_stack_fffffffffffffc60,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                              in_stack_fffffffffffffc50);
              std::__cxx11::string::~string(local_100);
              std::allocator<char>::~allocator((allocator<char> *)&local_101);
              local_e0 = in_stack_fffffffffffffc60;
              PerformPutCommon<short>
                        (in_stack_fffffffffffffb40,
                         (Variable<short> *)
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            }
            else {
              in_stack_fffffffffffffc5c = local_74;
              DVar5 = helper::GetDataType<int>();
              DVar3 = local_74;
              if (in_stack_fffffffffffffc5c == DVar5) {
                in_stack_fffffffffffffc50 = (string *)local_131;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)(local_131 + 1),"in call to PerformPuts, EndStep or Close",
                           (allocator *)in_stack_fffffffffffffc50);
                pVVar8 = Engine::FindVariable<int>
                                   ((Engine *)in_stack_fffffffffffffc60,
                                    (string *)
                                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                    in_stack_fffffffffffffc50);
                std::__cxx11::string::~string((string *)(local_131 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_131);
                local_110 = pVVar8;
                PerformPutCommon<int>
                          (in_stack_fffffffffffffb40,
                           (Variable<int> *)
                           CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
              }
              else {
                DVar4 = helper::GetDataType<long>();
                DVar5 = local_74;
                if (DVar3 == DVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&stack0xfffffffffffffea0,
                             "in call to PerformPuts, EndStep or Close",
                             (allocator *)&stack0xfffffffffffffe9f);
                  Engine::FindVariable<long>
                            ((Engine *)in_stack_fffffffffffffc60,
                             (string *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                             ,in_stack_fffffffffffffc50);
                  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
                  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
                  PerformPutCommon<long>
                            (in_stack_fffffffffffffb40,
                             (Variable<long> *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                }
                else {
                  DVar4 = helper::GetDataType<unsigned_char>();
                  DVar3 = local_74;
                  if (DVar5 == DVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_190,"in call to PerformPuts, EndStep or Close",&local_191);
                    Engine::FindVariable<unsigned_char>
                              ((Engine *)in_stack_fffffffffffffc60,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50);
                    std::__cxx11::string::~string(local_190);
                    std::allocator<char>::~allocator((allocator<char> *)&local_191);
                    PerformPutCommon<unsigned_char>
                              (in_stack_fffffffffffffb40,
                               (Variable<unsigned_char> *)
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                  }
                  else {
                    DVar4 = helper::GetDataType<unsigned_short>();
                    DVar5 = local_74;
                    if (DVar3 == DVar4) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_1c0,"in call to PerformPuts, EndStep or Close",&local_1c1);
                      pVVar9 = Engine::FindVariable<unsigned_short>
                                         ((Engine *)in_stack_fffffffffffffc60,
                                          (string *)
                                          CONCAT44(in_stack_fffffffffffffc5c,
                                                   in_stack_fffffffffffffc58),
                                          in_stack_fffffffffffffc50);
                      std::__cxx11::string::~string(local_1c0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
                      local_1a0 = pVVar9;
                      PerformPutCommon<unsigned_short>
                                (in_stack_fffffffffffffb40,
                                 (Variable<unsigned_short> *)
                                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                    }
                    else {
                      DVar4 = helper::GetDataType<unsigned_int>();
                      DVar3 = local_74;
                      if (DVar5 == DVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_1f0,"in call to PerformPuts, EndStep or Close",&local_1f1);
                        pVVar10 = Engine::FindVariable<unsigned_int>
                                            ((Engine *)in_stack_fffffffffffffc60,
                                             (string *)
                                             CONCAT44(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58),
                                             in_stack_fffffffffffffc50);
                        std::__cxx11::string::~string(local_1f0);
                        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
                        local_1d0 = pVVar10;
                        PerformPutCommon<unsigned_int>
                                  (in_stack_fffffffffffffb40,
                                   (Variable<unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                      }
                      else {
                        DVar4 = helper::GetDataType<unsigned_long>();
                        DVar5 = local_74;
                        if (DVar3 == DVar4) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_220,"in call to PerformPuts, EndStep or Close",&local_221
                                    );
                          pVVar11 = Engine::FindVariable<unsigned_long>
                                              ((Engine *)in_stack_fffffffffffffc60,
                                               (string *)
                                               CONCAT44(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58),
                                               in_stack_fffffffffffffc50);
                          std::__cxx11::string::~string(local_220);
                          std::allocator<char>::~allocator((allocator<char> *)&local_221);
                          local_200 = pVVar11;
                          PerformPutCommon<unsigned_long>
                                    (in_stack_fffffffffffffb40,
                                     (Variable<unsigned_long> *)
                                     CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                        }
                        else {
                          DVar4 = helper::GetDataType<float>();
                          DVar3 = local_74;
                          if (DVar5 == DVar4) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_250,"in call to PerformPuts, EndStep or Close",
                                       &local_251);
                            pVVar12 = Engine::FindVariable<float>
                                                ((Engine *)in_stack_fffffffffffffc60,
                                                 (string *)
                                                 CONCAT44(in_stack_fffffffffffffc5c,
                                                          in_stack_fffffffffffffc58),
                                                 in_stack_fffffffffffffc50);
                            std::__cxx11::string::~string(local_250);
                            std::allocator<char>::~allocator((allocator<char> *)&local_251);
                            local_230 = pVVar12;
                            PerformPutCommon<float>
                                      (in_stack_fffffffffffffb40,
                                       (Variable<float> *)
                                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                                      );
                          }
                          else {
                            DVar4 = helper::GetDataType<double>();
                            DVar5 = local_74;
                            if (DVar3 == DVar4) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_280,"in call to PerformPuts, EndStep or Close",
                                         &local_281);
                              pVVar13 = Engine::FindVariable<double>
                                                  ((Engine *)in_stack_fffffffffffffc60,
                                                   (string *)
                                                   CONCAT44(in_stack_fffffffffffffc5c,
                                                            in_stack_fffffffffffffc58),
                                                   in_stack_fffffffffffffc50);
                              std::__cxx11::string::~string(local_280);
                              std::allocator<char>::~allocator((allocator<char> *)&local_281);
                              local_260 = pVVar13;
                              PerformPutCommon<double>
                                        (in_stack_fffffffffffffb40,
                                         (Variable<double> *)
                                         CONCAT44(in_stack_fffffffffffffb3c,
                                                  in_stack_fffffffffffffb38));
                            }
                            else {
                              DVar3 = helper::GetDataType<long_double>();
                              if (DVar5 == DVar3) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_2b0,"in call to PerformPuts, EndStep or Close",
                                           &local_2b1);
                                in_stack_fffffffffffffb40 =
                                     (BP3Writer *)
                                     Engine::FindVariable<long_double>
                                               ((Engine *)in_stack_fffffffffffffc60,
                                                (string *)
                                                CONCAT44(in_stack_fffffffffffffc5c,
                                                         in_stack_fffffffffffffc58),
                                                in_stack_fffffffffffffc50);
                                std::__cxx11::string::~string(local_2b0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                                local_290 = in_stack_fffffffffffffb40;
                                PerformPutCommon<long_double>
                                          (in_stack_fffffffffffffb40,
                                           (Variable<long_double> *)
                                           CONCAT44(in_stack_fffffffffffffb3c,
                                                    in_stack_fffffffffffffb38));
                              }
                              else {
                                in_stack_fffffffffffffb3c = local_74;
                                DVar5 = helper::GetDataType<std::complex<float>>();
                                DVar3 = local_74;
                                if (in_stack_fffffffffffffb3c == DVar5) {
                                  in_stack_fffffffffffffb30 = (IO *)&local_2e1;
                                  in_stack_fffffffffffffb28 = local_70;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_2e0,"in call to PerformPuts, EndStep or Close",
                                             (allocator *)in_stack_fffffffffffffb30);
                                  pVVar14 = Engine::FindVariable<std::complex<float>>
                                                      ((Engine *)in_stack_fffffffffffffc60,
                                                       (string *)
                                                       CONCAT44(in_stack_fffffffffffffc5c,
                                                                in_stack_fffffffffffffc58),
                                                       in_stack_fffffffffffffc50);
                                  std::__cxx11::string::~string(local_2e0);
                                  std::allocator<char>::~allocator(&local_2e1);
                                  local_2c0 = pVVar14;
                                  PerformPutCommon<std::complex<float>>
                                            (in_stack_fffffffffffffb40,
                                             (Variable<std::complex<float>_> *)
                                             CONCAT44(in_stack_fffffffffffffb3c,
                                                      in_stack_fffffffffffffb38));
                                }
                                else {
                                  DVar5 = helper::GetDataType<std::complex<double>>();
                                  if (DVar3 == DVar5) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_310,"in call to PerformPuts, EndStep or Close",
                                               &local_311);
                                    in_stack_fffffffffffffb00 =
                                         Engine::FindVariable<std::complex<double>>
                                                   ((Engine *)in_stack_fffffffffffffc60,
                                                    (string *)
                                                    CONCAT44(in_stack_fffffffffffffc5c,
                                                             in_stack_fffffffffffffc58),
                                                    in_stack_fffffffffffffc50);
                                    std::__cxx11::string::~string(local_310);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_311);
                                    local_2f0 = in_stack_fffffffffffffb00;
                                    PerformPutCommon<std::complex<double>>
                                              (in_stack_fffffffffffffb40,
                                               (Variable<std::complex<double>_> *)
                                               CONCAT44(in_stack_fffffffffffffb3c,
                                                        in_stack_fffffffffffffb38));
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffb00);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x9fd03e);
    *(undefined8 *)(in_RDI + 0x458 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18)) = 0;
    local_24 = 0;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffb00);
  return;
}

Assistant:

void BP3Writer::PerformPuts()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::PerformPuts");
    if (m_BP3Serializer.m_DeferredVariables.empty())
    {
        return;
    }

    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_DeferredVariablesDataSize,
                                 "in call to PerformPuts");

    for (const std::string &variableName : m_BP3Serializer.m_DeferredVariables)
    {
        const DataType type = m_IO.InquireVariableType(variableName);
        if (type == DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable =                                                                    \
            FindVariable<T>(variableName, "in call to PerformPuts, EndStep or Close");             \
        PerformPutCommon(variable);                                                                \
    }

        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    m_BP3Serializer.m_DeferredVariables.clear();
    m_BP3Serializer.m_DeferredVariablesDataSize = 0;
}